

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLoader.c
# Opt level: O1

void DataLoader_Deinit(DATA_LOADER *dLoader)

{
  void *__ptr;
  DLOADCB_GEN_CALL p_Var1;
  
  if (dLoader != (DATA_LOADER *)0x0) {
    DataLoader_Reset(dLoader);
    __ptr = dLoader->_context;
    if (__ptr != (void *)0x0) {
      p_Var1 = dLoader->_callbacks->ddeinit;
      if (p_Var1 == (DLOADCB_GEN_CALL)0x0) {
        free(__ptr);
      }
      else {
        (*p_Var1)(__ptr);
      }
    }
    free(dLoader);
    return;
  }
  return;
}

Assistant:

void DataLoader_Deinit(DATA_LOADER *dLoader)
{
	if(dLoader == NULL) return;
	DataLoader_Reset(dLoader);
	if(dLoader->_context != NULL)
	{
		if (dLoader->_callbacks->ddeinit)
			dLoader->_callbacks->ddeinit(dLoader->_context);
		else
			free(dLoader->_context);
	}
	free(dLoader);
}